

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O1

bool __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::CheckEnumForBuffer
          (BlendMaskStateMachine *this,int idx,GLenum e,GLenum s)

{
  ostringstream *this_00;
  bool bVar1;
  GLboolean b;
  GLint i;
  GLint64 li;
  GLboolean local_1b6;
  GLboolean local_1b5;
  GLenum local_1b4;
  GLenum local_1b0 [2];
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  (*this->gl->getIntegeri_v)(e,idx,(GLint *)&local_1b4);
  (*this->gl->getInteger64i_v)(e,idx,(GLint64 *)local_1b0);
  (*this->gl->getBooleani_v)(e,idx,&local_1b6);
  if (((local_1b4 != s) || (local_1b0[0] != s)) || (bVar1 = true, (bool)local_1b6 != (s != 0))) {
    local_1a8._0_8_ = this->testLog;
    this_00 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"State for ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," in buffer #",0xc);
    std::ostream::operator<<(this_00,idx);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," should be set to ",0x12)
    ;
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," but found the following values:\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"int: ",5);
    std::ostream::operator<<(this_00,local_1b4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"int64: ",7);
    std::ostream::_M_insert<long>((long)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"bool: ",6);
    local_1b5 = local_1b6;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,(char *)&local_1b5,1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_130);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DrawBuffersIndexedBase::BlendMaskStateMachine::CheckEnumForBuffer(int idx, glw::GLenum e, glw::GLenum s)
{
	glw::GLint	 i;
	glw::GLint64   li;
	glw::GLboolean b;

	gl.getIntegeri_v(e, idx, &i);
	gl.getInteger64i_v(e, idx, &li);
	gl.getBooleani_v(e, idx, &b);
	if ((static_cast<glw::GLenum>(i) != s) || (static_cast<glw::GLenum>(li) != s) || (b != (s ? GL_TRUE : GL_FALSE)))
	{
		testLog << tcu::TestLog::Message << "State for " << e << " in buffer #" << idx << " should be set to " << s
				<< " but found the following values:\n"
				<< "int: " << i << "\n"
				<< "int64: " << li << "\n"
				<< "bool: " << b << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}